

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O1

string * __thiscall
Vault::
Tiny<Vault::PortDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::toString(string *__return_storage_ptr__,
          Tiny<Vault::PortDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  ostringstream ss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(this->value_)._M_dataplus._M_p,(this->value_)._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string toString() const {
    std::ostringstream ss;
    ss << value();
    return ss.str();
  }